

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_sub.cpp
# Opt level: O2

int64_t duckdb::DateSub::CenturyOperator::Operation<duckdb::dtime_t,duckdb::dtime_t,long>
                  (dtime_t startdate,dtime_t enddate)

{
  NotImplementedException *this;
  allocator local_39;
  string local_38 [32];
  
  this = (NotImplementedException *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string(local_38,"\"time\" units \"century\" not recognized",&local_39);
  duckdb::NotImplementedException::NotImplementedException(this,local_38);
  __cxa_throw(this,&NotImplementedException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int64_t DateSub::CenturyOperator::Operation(dtime_t startdate, dtime_t enddate) {
	throw NotImplementedException("\"time\" units \"century\" not recognized");
}